

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

QName * __thiscall
Assimp::CFIReaderImpl::parseNameSurrogate(QName *__return_storage_ptr__,CFIReaderImpl *this)

{
  byte bVar1;
  byte *pbVar2;
  DeadlyImportError *pDVar3;
  size_t sVar4;
  size_type sVar5;
  reference pvVar6;
  size_t index;
  uint8_t b;
  CFIReaderImpl *this_local;
  QName *result;
  
  if ((long)this->dataEnd - (long)this->dataP < 1) {
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(pDVar3,(string *)parseErrorMessage_abi_cxx11_);
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pbVar2 = this->dataP;
  this->dataP = pbVar2 + 1;
  bVar1 = *pbVar2;
  if ((bVar1 & 0xfc) != 0) {
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(pDVar3,(string *)parseErrorMessage_abi_cxx11_);
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  QName::QName(__return_storage_ptr__);
  if ((bVar1 & 2) != 0) {
    if (((long)this->dataEnd - (long)this->dataP < 1) || ((*this->dataP & 0x80) != 0)) {
      pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(pDVar3,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    sVar4 = parseInt2(this);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->vocabulary).prefixTable);
    if (sVar5 <= sVar4) {
      pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(pDVar3,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(this->vocabulary).prefixTable,sVar4);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)pvVar6);
  }
  if ((bVar1 & 1) != 0) {
    if (((long)this->dataEnd - (long)this->dataP < 1) || ((*this->dataP & 0x80) != 0)) {
      pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(pDVar3,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    sVar4 = parseInt2(this);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->vocabulary).namespaceNameTable);
    if (sVar5 <= sVar4) {
      pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(pDVar3,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(this->vocabulary).namespaceNameTable,sVar4);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->uri,(string *)pvVar6);
  }
  if ((0 < (long)this->dataEnd - (long)this->dataP) && ((*this->dataP & 0x80) == 0)) {
    sVar4 = parseInt2(this);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->vocabulary).localNameTable);
    if (sVar4 < sVar5) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&(this->vocabulary).localNameTable,sVar4);
      std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,(string *)pvVar6);
      return __return_storage_ptr__;
    }
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(pDVar3,(string *)parseErrorMessage_abi_cxx11_);
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  DeadlyImportError::DeadlyImportError(pDVar3,(string *)parseErrorMessage_abi_cxx11_);
  __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

QName parseNameSurrogate() { // C.16
        if (dataEnd - dataP < 1) {
            throw DeadlyImportError(parseErrorMessage);
        }
        uint8_t b = *dataP++;
        if (b & 0xfc) { // Padding '000000' C.2.5.5
            throw DeadlyImportError(parseErrorMessage);
        }
        QName result;
        size_t index;
        if (b & 0x02) { // prefix (C.16.3)
            if ((dataEnd - dataP < 1) || (*dataP & 0x80)) {
                throw DeadlyImportError(parseErrorMessage);
            }
            index = parseInt2();
            if (index >= vocabulary.prefixTable.size()) {
                throw DeadlyImportError(parseErrorMessage);
            }
            result.prefix = vocabulary.prefixTable[index];
        }
        if (b & 0x01) { // namespace-name (C.16.4)
            if ((dataEnd - dataP < 1) || (*dataP & 0x80)) {
                throw DeadlyImportError(parseErrorMessage);
            }
            index = parseInt2();
            if (index >= vocabulary.namespaceNameTable.size()) {
                throw DeadlyImportError(parseErrorMessage);
            }
            result.uri = vocabulary.namespaceNameTable[index];
        }
        // local-name
        if ((dataEnd - dataP < 1) || (*dataP & 0x80)) {
            throw DeadlyImportError(parseErrorMessage);
        }
        index = parseInt2();
        if (index >= vocabulary.localNameTable.size()) {
            throw DeadlyImportError(parseErrorMessage);
        }
        result.name = vocabulary.localNameTable[index];
        return result;
    }